

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::clear_value
          (CustomModel_CustomModelParamValue *this)

{
  if ((this->_oneof_case_[0] == 0x3c) || (this->_oneof_case_[0] == 0x14)) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArena
              (&(this->value_).stringvalue_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void CustomModel_CustomModelParamValue::clear_value() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  switch (value_case()) {
    case kDoubleValue: {
      // No need to clear
      break;
    }
    case kStringValue: {
      value_.stringvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case kIntValue: {
      // No need to clear
      break;
    }
    case kLongValue: {
      // No need to clear
      break;
    }
    case kBoolValue: {
      // No need to clear
      break;
    }
    case kBytesValue: {
      value_.bytesvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = VALUE_NOT_SET;
}